

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Label.cpp
# Opt level: O0

void __thiscall entities::Label::Label(Label *this,Chunk *chunk,uint tileIndex)

{
  path *this_00;
  LodRenderer *this_01;
  LodRenderer *coords;
  repr rVar1;
  uint in_EDX;
  Chunk *in_RSI;
  Entity *in_RDI;
  Drawable *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff60;
  format fmt;
  char (*in_stack_ffffffffffffff68) [23];
  uint characterSize;
  Font *font;
  locale *this_02;
  Text *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  String *in_stack_ffffffffffffffa0;
  locale local_40 [48];
  Chunk *local_10;
  
  fmt = (format)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_10 = in_RSI;
  Entity::Entity(in_RDI,in_RSI,in_EDX);
  sf::Drawable::Drawable((Drawable *)(in_RDI + 1));
  in_RDI->_vptr_Entity = (_func_int **)&PTR__Label_0047d2d0;
  in_RDI[1]._vptr_Entity = (_func_int **)&DAT_0047d308;
  font = (Font *)&in_RDI[1].chunk_;
  this_02 = local_40;
  std::locale::locale(this_02);
  characterSize = (uint)((ulong)in_RDI >> 0x20);
  sf::String::String(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     (locale *)in_stack_ffffffffffffff90);
  this_00 = (path *)Locator::getResource();
  ghc::filesystem::path::path<char[23],ghc::filesystem::path>(this_00,in_stack_ffffffffffffff68,fmt)
  ;
  (**(code **)(*(long *)&this_00->_path + 0x18))(this_00,&stack0xffffffffffffff90);
  sf::Text::Text(in_stack_ffffffffffffff90,(String *)this_02,font,characterSize);
  ghc::filesystem::path::~path((path *)0x15bcb0);
  sf::String::~String((String *)0x15bcbd);
  std::locale::~locale(local_40);
  spdlog::debug<char[31]>((char (*) [31])0x15bcd3);
  this_01 = Chunk::getLodRenderer(local_10);
  if (this_01 != (LodRenderer *)0x0) {
    coords = Chunk::getLodRenderer(local_10);
    rVar1 = Chunk::getCoords(local_10);
    LodRenderer::addDecoration(this_01,(repr)coords,(uint)(rVar1 >> 0x20),in_stack_ffffffffffffff48)
    ;
  }
  return;
}

Assistant:

Label::Label(Chunk& chunk, unsigned int tileIndex) :
    Entity(chunk, tileIndex),
    text_("", Locator::getResource()->getFont("resources/consolas.ttf"), 30) {

    spdlog::debug("Label entity has been created.");
    if (chunk.getLodRenderer() != nullptr) {
        chunk.getLodRenderer()->addDecoration(chunk.getCoords(), tileIndex, this);
    }
}